

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O3

void enet_host_bandwidth_throttle(ENetHost *host)

{
  uint uVar1;
  bool bVar2;
  enet_uint32 eVar3;
  uint uVar4;
  ENetPeer *pEVar5;
  ENetPeer *pEVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ENetProtocol local_60;
  
  eVar3 = enet_time_get();
  uVar12 = eVar3 - host->bandwidthThrottleEpoch;
  if (uVar12 < 1000) {
    return;
  }
  uVar14 = (uint)host->connectedPeers;
  uVar11 = (ulong)uVar14;
  host->bandwidthThrottleEpoch = eVar3;
  if (uVar14 == 0) {
    return;
  }
  if (host->outgoingBandwidth == 0) {
    uVar13 = 0xffffffff;
    uVar7 = 0xffffffff;
  }
  else {
    uVar7 = (host->outgoingBandwidth * uVar12) / 1000;
    if ((long)host->peerCount < 1) {
      uVar13 = 0;
    }
    else {
      pEVar6 = host->peers;
      pEVar5 = pEVar6 + host->peerCount;
      uVar13 = 0;
      do {
        if (pEVar6->state - ENET_PEER_STATE_CONNECTED < 2) {
          uVar13 = uVar13 + pEVar6->outgoingDataTotal;
        }
        pEVar6 = pEVar6 + 1;
      } while (pEVar6 < pEVar5);
    }
  }
  if (host->bandwidthLimitedPeers != 0) {
    pEVar6 = host->peers;
    sVar10 = host->peerCount;
    while( true ) {
      uVar9 = 0x20;
      if (uVar7 < uVar13) {
        uVar9 = (uVar7 << 5) / uVar13;
      }
      if ((long)sVar10 < 1) break;
      bVar2 = false;
      pEVar5 = pEVar6;
      do {
        if (((pEVar5->state - ENET_PEER_STATE_CONNECTED < 2) && (pEVar5->incomingBandwidth != 0)) &&
           (pEVar5->outgoingBandwidthThrottleEpoch != eVar3)) {
          uVar8 = pEVar5->incomingBandwidth * uVar12;
          uVar1 = pEVar5->outgoingDataTotal;
          if (uVar8 / 1000 < uVar1 * uVar9 >> 5) {
            uVar8 = uVar8 / 1000;
            uVar4 = (uVar8 << 5) / uVar1;
            if (uVar8 << 5 < uVar1) {
              uVar4 = 1;
            }
            pEVar5->packetThrottleLimit = uVar4;
            if (uVar4 < pEVar5->packetThrottle) {
              pEVar5->packetThrottle = uVar4;
            }
            pEVar5->outgoingBandwidthThrottleEpoch = eVar3;
            pEVar5->incomingDataTotal = 0;
            pEVar5->outgoingDataTotal = 0;
            uVar14 = uVar14 - 1;
            uVar7 = uVar7 - uVar8;
            uVar13 = uVar13 - uVar8;
            bVar2 = true;
          }
        }
        pEVar5 = pEVar5 + 1;
      } while (pEVar5 < pEVar6 + sVar10);
      if ((uVar14 == 0) || (!bVar2)) break;
    }
    if (uVar14 == 0) goto LAB_0015e9df;
  }
  uVar12 = 0x20;
  if (uVar7 < uVar13) {
    uVar12 = (uVar7 << 5) / uVar13;
  }
  if (0 < (long)host->peerCount) {
    pEVar6 = host->peers;
    pEVar5 = pEVar6 + host->peerCount;
    do {
      if ((pEVar6->state - ENET_PEER_STATE_CONNECTED < 2) &&
         (pEVar6->outgoingBandwidthThrottleEpoch != eVar3)) {
        pEVar6->packetThrottleLimit = uVar12;
        if (uVar12 < pEVar6->packetThrottle) {
          pEVar6->packetThrottle = uVar12;
        }
        pEVar6->incomingDataTotal = 0;
        pEVar6->outgoingDataTotal = 0;
      }
      pEVar6 = pEVar6 + 1;
    } while (pEVar6 < pEVar5);
  }
LAB_0015e9df:
  if (host->recalculateBandwidthLimits != 0) {
    host->recalculateBandwidthLimits = 0;
    uVar12 = host->incomingBandwidth;
    if (uVar12 == 0) {
      sVar10 = host->peerCount;
      uVar14 = 0;
    }
    else {
      pEVar6 = host->peers;
      sVar10 = host->peerCount;
      do {
        if ((long)sVar10 < 1) {
          return;
        }
        uVar14 = (uint)(uVar12 / uVar11);
        bVar2 = false;
        pEVar5 = pEVar6;
        do {
          if (((pEVar5->state - ENET_PEER_STATE_CONNECTED < 2) &&
              (pEVar5->incomingBandwidthThrottleEpoch != eVar3)) &&
             ((uVar7 = pEVar5->outgoingBandwidth, uVar7 == 0 || (uVar7 < uVar14)))) {
            pEVar5->incomingBandwidthThrottleEpoch = eVar3;
            uVar11 = (ulong)((int)uVar11 - 1);
            uVar12 = uVar12 - uVar7;
            bVar2 = true;
          }
          pEVar5 = pEVar5 + 1;
        } while (pEVar5 < pEVar6 + sVar10);
      } while (((int)uVar11 != 0) && (bVar2));
    }
    if (0 < (long)sVar10) {
      pEVar6 = host->peers;
      pEVar5 = pEVar6;
      do {
        if (pEVar5->state - ENET_PEER_STATE_CONNECTED < 2) {
          local_60._0_2_ = 0xff8a;
          uVar12 = host->outgoingBandwidth;
          local_60.connect.mtu =
               uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
          local_60.disconnect.data =
               uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
          if (pEVar5->incomingBandwidthThrottleEpoch == eVar3) {
            uVar12 = pEVar5->outgoingBandwidth;
            local_60.disconnect.data =
                 uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18
            ;
          }
          enet_peer_queue_outgoing_command(pEVar5,&local_60,(ENetPacket *)0x0,0,0);
          pEVar6 = host->peers;
          sVar10 = host->peerCount;
        }
        pEVar5 = pEVar5 + 1;
      } while (pEVar5 < pEVar6 + sVar10);
    }
  }
  return;
}

Assistant:

void
enet_host_bandwidth_throttle (ENetHost * host)
{
    enet_uint32 timeCurrent = enet_time_get (),
           elapsedTime = timeCurrent - host -> bandwidthThrottleEpoch,
           peersRemaining = (enet_uint32) host -> connectedPeers,
           dataTotal = ~0,
           bandwidth = ~0,
           throttle = 0,
           bandwidthLimit = 0;
    int needsAdjustment = host -> bandwidthLimitedPeers > 0 ? 1 : 0;
    ENetPeer * peer;
    ENetProtocol command;

    if (elapsedTime < ENET_HOST_BANDWIDTH_THROTTLE_INTERVAL)
      return;

    host -> bandwidthThrottleEpoch = timeCurrent;

    if (peersRemaining == 0)
      return;

    if (host -> outgoingBandwidth != 0)
    {
        dataTotal = 0;
        bandwidth = (host -> outgoingBandwidth * elapsedTime) / 1000;

        for (peer = host -> peers;
             peer < & host -> peers [host -> peerCount];
            ++ peer)
        {
            if (peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER)
              continue;

            dataTotal += peer -> outgoingDataTotal;
        }
    }

    while (peersRemaining > 0 && needsAdjustment != 0)
    {
        needsAdjustment = 0;
        
        if (dataTotal <= bandwidth)
          throttle = ENET_PEER_PACKET_THROTTLE_SCALE;
        else
          throttle = (bandwidth * ENET_PEER_PACKET_THROTTLE_SCALE) / dataTotal;

        for (peer = host -> peers;
             peer < & host -> peers [host -> peerCount];
             ++ peer)
        {
            enet_uint32 peerBandwidth;
            
            if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                peer -> incomingBandwidth == 0 ||
                peer -> outgoingBandwidthThrottleEpoch == timeCurrent)
              continue;

            peerBandwidth = (peer -> incomingBandwidth * elapsedTime) / 1000;
            if ((throttle * peer -> outgoingDataTotal) / ENET_PEER_PACKET_THROTTLE_SCALE <= peerBandwidth)
              continue;

            peer -> packetThrottleLimit = (peerBandwidth * 
                                            ENET_PEER_PACKET_THROTTLE_SCALE) / peer -> outgoingDataTotal;
            
            if (peer -> packetThrottleLimit == 0)
              peer -> packetThrottleLimit = 1;
            
            if (peer -> packetThrottle > peer -> packetThrottleLimit)
              peer -> packetThrottle = peer -> packetThrottleLimit;

            peer -> outgoingBandwidthThrottleEpoch = timeCurrent;

            peer -> incomingDataTotal = 0;
            peer -> outgoingDataTotal = 0;

            needsAdjustment = 1;
            -- peersRemaining;
            bandwidth -= peerBandwidth;
            dataTotal -= peerBandwidth;
        }
    }

    if (peersRemaining > 0)
    {
        if (dataTotal <= bandwidth)
          throttle = ENET_PEER_PACKET_THROTTLE_SCALE;
        else
          throttle = (bandwidth * ENET_PEER_PACKET_THROTTLE_SCALE) / dataTotal;

        for (peer = host -> peers;
             peer < & host -> peers [host -> peerCount];
             ++ peer)
        {
            if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                peer -> outgoingBandwidthThrottleEpoch == timeCurrent)
              continue;

            peer -> packetThrottleLimit = throttle;

            if (peer -> packetThrottle > peer -> packetThrottleLimit)
              peer -> packetThrottle = peer -> packetThrottleLimit;

            peer -> incomingDataTotal = 0;
            peer -> outgoingDataTotal = 0;
        }
    }

    if (host -> recalculateBandwidthLimits)
    {
       host -> recalculateBandwidthLimits = 0;

       peersRemaining = (enet_uint32) host -> connectedPeers;
       bandwidth = host -> incomingBandwidth;
       needsAdjustment = 1;

       if (bandwidth == 0)
         bandwidthLimit = 0;
       else
       while (peersRemaining > 0 && needsAdjustment != 0)
       {
           needsAdjustment = 0;
           bandwidthLimit = bandwidth / peersRemaining;

           for (peer = host -> peers;
                peer < & host -> peers [host -> peerCount];
                ++ peer)
           {
               if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                   peer -> incomingBandwidthThrottleEpoch == timeCurrent)
                 continue;

               if (peer -> outgoingBandwidth > 0 &&
                   peer -> outgoingBandwidth >= bandwidthLimit)
                 continue;

               peer -> incomingBandwidthThrottleEpoch = timeCurrent;
 
               needsAdjustment = 1;
               -- peersRemaining;
               bandwidth -= peer -> outgoingBandwidth;
           }
       }

       for (peer = host -> peers;
            peer < & host -> peers [host -> peerCount];
            ++ peer)
       {
           if (peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER)
             continue;

           command.header.command = ENET_PROTOCOL_COMMAND_BANDWIDTH_LIMIT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
           command.header.channelID = 0xFF;
           command.bandwidthLimit.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);

           if (peer -> incomingBandwidthThrottleEpoch == timeCurrent)
             command.bandwidthLimit.incomingBandwidth = ENET_HOST_TO_NET_32 (peer -> outgoingBandwidth);
           else
             command.bandwidthLimit.incomingBandwidth = ENET_HOST_TO_NET_32 (bandwidthLimit);

           enet_peer_queue_outgoing_command (peer, & command, NULL, 0, 0);
       } 
    }
}